

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode
          (ImmediateBrokenPromiseNode *this,Exception *exception)

{
  Exception *other;
  Exception *exception_local;
  ImmediateBrokenPromiseNode *this_local;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_005d2710;
  other = mv<kj::Exception>(exception);
  Exception::Exception(&this->exception,other);
  return;
}

Assistant:

ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode(Exception&& exception)
    : exception(kj::mv(exception)) {}